

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O2

summary<double> * __thiscall
foxxll::stats_data::get_read_speed_summary(summary<double> *__return_storage_ptr__,stats_data *this)

{
  double *pdVar1;
  pointer pfVar2;
  pointer ppVar3;
  double dVar4;
  ulong uVar5;
  long lVar6;
  pointer ppVar7;
  file_stats_data *f;
  pointer pfVar8;
  pointer ppVar9;
  undefined1 auVar10 [16];
  uint local_3c;
  double local_38;
  
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
  reserve(&__return_storage_ptr__->values_per_device,
          ((long)(this->file_stats_data_list_).
                 super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->file_stats_data_list_).
                super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pfVar2 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pfVar8 = (this->file_stats_data_list_).
                super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                ._M_impl.super__Vector_impl_data._M_start; pfVar8 != pfVar2; pfVar8 = pfVar8 + 1) {
    local_38 = (((double)CONCAT44(0x45300000,(int)(pfVar8->read_bytes_ >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)pfVar8->read_bytes_) - 4503599627370496.0)) /
               pfVar8->read_time_;
    local_3c = pfVar8->device_id_;
    std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>::
    emplace_back<double,unsigned_int>
              ((vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>
                *)&__return_storage_ptr__->values_per_device,&local_38,&local_3c);
  }
  ppVar7 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != ppVar3) {
    uVar5 = (long)ppVar3 - (long)ppVar7 >> 4;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
              (ppVar7,ppVar3,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar3 - (long)ppVar7 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
                (ppVar7,ppVar3);
    }
    else {
      ppVar9 = ppVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
                (ppVar7,ppVar9);
      for (; ppVar9 != ppVar3; ppVar9 = ppVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_int>*,std::vector<std::pair<double,unsigned_int>,std::allocator<std::pair<double,unsigned_int>>>>,__gnu_cxx::__ops::_Val_comp_iter<foxxll::stats_data::summary<double>::summary<foxxll::stats_data::get_read_speed_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_speed_summary()const::__0_const&)::_lambda(std::pair<double,unsigned_int>,std::pair<double,unsigned_int>)_1_>>
                  (ppVar9);
      }
    }
  }
  ppVar7 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)ppVar3 - (long)ppVar7;
  if ((long)ppVar3 - (long)ppVar7 == 0) {
    __return_storage_ptr__->max = NAN;
    __return_storage_ptr__->median = NAN;
    __return_storage_ptr__->total = NAN;
    __return_storage_ptr__->min = NAN;
    dVar4 = NAN;
  }
  else {
    uVar5 = lVar6 >> 4;
    __return_storage_ptr__->min = ppVar7->first;
    __return_storage_ptr__->max = ppVar3[-1].first;
    pdVar1 = &ppVar7->first + (uVar5 & 0xfffffffffffffffe);
    if (((long)ppVar3 - (long)ppVar7 & 0x10U) == 0) {
      dVar4 = (pdVar1[-2] + *pdVar1) * 0.5;
    }
    else {
      dVar4 = *pdVar1;
    }
    __return_storage_ptr__->median = dVar4;
    dVar4 = 0.0;
    for (; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
      dVar4 = dVar4 + ppVar7->first;
    }
    __return_storage_ptr__->total = dVar4;
    auVar10._8_4_ = (int)(lVar6 >> 0x24);
    auVar10._0_8_ = uVar5;
    auVar10._12_4_ = 0x45300000;
    dVar4 = dVar4 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
  }
  __return_storage_ptr__->average = dVar4;
  return __return_storage_ptr__;
}

Assistant:

stats_data::summary<double> stats_data::get_read_speed_summary() const
{
    return {
               file_stats_data_list_, [](const file_stats_data& fsd) {
                   return static_cast<double>(fsd.get_read_bytes()) / fsd.get_read_time();
               }
    };
}